

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int dialer_set(nng_dialer id,char *n,void *v,size_t sz,nni_type t)

{
  int iVar1;
  nni_dialer *pnStack_38;
  int rv;
  nni_dialer *d;
  size_t sStack_28;
  nni_type t_local;
  size_t sz_local;
  void *v_local;
  char *n_local;
  nng_dialer id_local;
  
  d._4_4_ = t;
  sStack_28 = sz;
  sz_local = (size_t)v;
  v_local = n;
  n_local._0_4_ = id.id;
  n_local._4_4_ = nni_dialer_find(&stack0xffffffffffffffc8,id.id);
  if (n_local._4_4_ == 0) {
    iVar1 = nni_dialer_setopt(pnStack_38,(char *)v_local,(void *)sz_local,sStack_28,d._4_4_);
    nni_dialer_rele(pnStack_38);
    n_local._4_4_ = iVar1;
  }
  return n_local._4_4_;
}

Assistant:

static int
dialer_set(nng_dialer id, const char *n, const void *v, size_t sz, nni_type t)
{
	nni_dialer *d;
	int         rv;

	if ((rv = nni_dialer_find(&d, id.id)) != 0) {
		return (rv);
	}
	rv = nni_dialer_setopt(d, n, v, sz, t);
	nni_dialer_rele(d);
	return (rv);
}